

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::ElementsAreMatcherImpl<const_phmap::priv::BitMask<unsigned_int,_16,_0>_&>::
MatchAndExplain(ElementsAreMatcherImpl<const_phmap::priv::BitMask<unsigned_int,_16,_0>_&> *this,
               BitMask<unsigned_int,_16,_0> *container,MatchResultListener *listener)

{
  ostream *poVar1;
  int iVar2;
  pointer pbVar3;
  bool bVar4;
  uint uVar5;
  MatchResultListener *pMVar6;
  pointer pMVar7;
  size_t sVar8;
  pointer pMVar9;
  _func_int **pp_Var10;
  long lVar11;
  size_t sVar12;
  long local_218;
  size_t local_210;
  BitMask<unsigned_int,_16,_0> *local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  uint local_1e8 [8];
  StringMatchResultListener s;
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explanations,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&s);
  uVar5 = container->mask_;
  local_218 = 0;
  lVar11 = 0;
  local_208 = container;
  for (sVar8 = 0;
      (sVar12 = sVar8, local_210 = sVar8, uVar5 != 0 &&
      (pMVar7 = (this->matchers_).
                super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      sVar8 != ((long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar7) / 0x18));
      sVar8 = sVar8 + 1) {
    if (poVar1 == (ostream *)0x0) {
      iVar2 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
        }
      }
      s.super_MatchResultListener._vptr_MatchResultListener =
           (_func_int **)CONCAT44(s.super_MatchResultListener._vptr_MatchResultListener._4_4_,iVar2)
      ;
      bVar4 = MatcherBase<const_int_&>::Matches
                        ((MatcherBase<const_int_&> *)
                         ((long)&(pMVar7->super_MatcherBase<const_int_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                         local_218),(int *)&s);
    }
    else {
      StringMatchResultListener::StringMatchResultListener(&s);
      local_1e8[0] = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> local_1e8[0] & 1) == 0; local_1e8[0] = local_1e8[0] + 1) {
        }
      }
      bVar4 = MatcherBase<const_int_&>::MatchAndExplain
                        ((MatcherBase<const_int_&> *)
                         ((long)&(((this->matchers_).
                                   super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_MatcherBase<const_int_&>).super_MatcherDescriberInterface.
                                 _vptr_MatcherDescriberInterface + local_218),(int *)local_1e8,
                         &s.super_MatchResultListener);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&((explanations.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11),
                 (string *)local_1e8);
      std::__cxx11::string::~string((string *)local_1e8);
      StringMatchResultListener::~StringMatchResultListener(&s);
    }
    if (!bVar4) {
      bVar4 = true;
      goto LAB_0013c8ce;
    }
    uVar5 = uVar5 - 1 & uVar5;
    lVar11 = lVar11 + 0x20;
    local_218 = local_218 + 0x18;
  }
  bVar4 = false;
LAB_0013c8ce:
  for (; uVar5 != 0; uVar5 = uVar5 - 1 & uVar5) {
    sVar12 = sVar12 + 1;
  }
  pMVar7 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar9 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pMVar9 - (long)pMVar7) / 0x18 == sVar12) {
    if (!bVar4) {
      bVar4 = true;
      if (poVar1 != (ostream *)0x0) {
        bVar4 = false;
        pp_Var10 = (_func_int **)0x0;
        while (pbVar3 = explanations.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              s.super_MatchResultListener._vptr_MatchResultListener = pp_Var10,
              pp_Var10 != (_func_int **)(((long)pMVar9 - (long)pMVar7) / 0x18)) {
          if (explanations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)pp_Var10]._M_string_length != 0) {
            if (bVar4) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar6 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            pMVar6 = MatchResultListener::operator<<(pMVar6,(unsigned_long *)&s);
            pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [11])" matches, ");
            MatchResultListener::operator<<(pMVar6,pbVar3 + (long)pp_Var10);
            pMVar7 = (this->matchers_).
                     super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar9 = (this->matchers_).
                     super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar4 = true;
          }
          pp_Var10 = (_func_int **)((long)s.super_MatchResultListener._vptr_MatchResultListener + 1)
          ;
        }
        bVar4 = true;
      }
      goto LAB_0013caf3;
    }
    if (poVar1 != (ostream *)0x0) {
      uVar5 = local_208->mask_;
      while (bVar4 = sVar8 != 0, sVar8 = sVar8 - 1, bVar4) {
        uVar5 = uVar5 - 1 & uVar5;
      }
      pMVar6 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      pMVar6 = MatchResultListener::operator<<(pMVar6,&local_210);
      pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [3])0x1770c9);
      local_1e8[0] = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> local_1e8[0] & 1) == 0; local_1e8[0] = local_1e8[0] + 1) {
        }
      }
      PrintToString<unsigned_int>((string *)&s,local_1e8);
      pMVar6 = MatchResultListener::operator<<
                         (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&s);
      MatchResultListener::operator<<(pMVar6,(char (*) [3])") ");
      std::__cxx11::string::~string((string *)&s);
      MatcherBase<const_int_&>::DescribeNegationTo
                (&(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_210].
                  super_MatcherBase<const_int_&>,listener->stream_);
      PrintIfNotEmpty(explanations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_210,listener->stream_);
    }
  }
  else if (sVar12 != 0 && poVar1 != (ostream *)0x0) {
    pMVar6 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_phmap::priv::BitMask<unsigned_int,_16,_0>_&> *)&s,sVar12)
    ;
    MatchResultListener::operator<<(pMVar6,(Message *)&s);
    if (s.super_MatchResultListener._vptr_MatchResultListener != (_func_int **)0x0) {
      (**(code **)(*s.super_MatchResultListener._vptr_MatchResultListener + 8))();
    }
  }
  bVar4 = false;
LAB_0013caf3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explanations);
  return bVar4;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    auto it = stl_container.begin();
    size_t exam_pos = 0;
    bool unmatched_found = false;

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        unmatched_found = true;
        // We cannot store the iterator for the unmatched element to be used
        // later, as some users use ElementsAre() with a "container" whose
        // iterator is not copy-constructible or copy-assignable.
        //
        // We cannot store a pointer to the element either, as some container's
        // iterators return a temporary.
        //
        // We cannot store the element itself either, as the element may not be
        // copyable.
        //
        // Therefore, we just remember the index of the unmatched element,
        // and use it later to print the unmatched element.
        break;
      }
    }
    // If unmatched_found is true, exam_pos is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (unmatched_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        // Find the unmatched element.
        auto unmatched_it = stl_container.begin();
        // We cannot call std::advance() on the iterator, as some users use
        // ElementsAre() with a "container" whose iterator is incompatible with
        // std::advance() (e.g. it may not have the difference_type member
        // type).
        for (size_t i = 0; i != exam_pos; ++i) {
          ++unmatched_it;
        }

        // If the array is long or the elements' print-out is large, it may be
        // hard for the user to find the mismatched element and its
        // corresponding matcher description. Therefore we print the index, the
        // value of the mismatched element, and the corresponding matcher
        // description to ease debugging.
        *listener << "whose element #" << exam_pos << " ("
                  << PrintToString(*unmatched_it) << ") ";
        matchers_[exam_pos].DescribeNegationTo(listener->stream());
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }